

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O0

uchar * rans_compress_O1(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  byte *pbVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  RansEncSymbol *s0;
  RansEncSymbol *s1;
  RansEncSymbol *s2;
  RansEncSymbol *s3;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  uchar c3_1;
  uchar c2;
  uchar c1;
  uchar c0;
  uchar c3;
  uchar l3;
  uchar l2;
  uchar l1;
  uchar l0;
  int i3;
  int i2;
  int i1;
  int i0;
  int isz4;
  uint8_t *ptr;
  RansState rans3;
  RansState rans2;
  RansState rans1;
  RansState rans0;
  int *F_i_;
  double p;
  int iVar15;
  uint x;
  int M;
  int m;
  int t2;
  uchar c;
  uint uVar16;
  int j;
  int i;
  int T [256];
  int F [256] [256];
  RansEncSymbol syms [256] [256];
  uint local_50;
  uint local_4c;
  uint rle_j;
  uint rle_i;
  uint tab_size;
  uint last_i;
  uchar *cp;
  uchar *out_end;
  uchar *out_buf;
  uint *out_size_local;
  uint in_size_local;
  uchar *in_local;
  
  if (in_size < 4) {
    in_local = rans_compress_O0(in,in_size,out_size);
  }
  else {
    dVar11 = (double)in_size * 1.05 + 198147.0 + 9.0;
    uVar9 = (ulong)dVar11;
    in_local = (uchar *)malloc(uVar9 | (long)(dVar11 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f)
    ;
    if (in_local == (uchar *)0x0) {
      in_local = (uchar *)0x0;
    }
    else {
      puVar7 = in_local + (long)(int)((double)in_size * 1.05) + 0x3060c;
      _tab_size = in_local + 9;
      memset(T + 0xfe,0,0x40000);
      memset(&j,0,0x400);
      rle_i = 0;
      for (uVar16 = 0; uVar16 < in_size; uVar16 = uVar16 + 1) {
        m._3_1_ = in[(int)uVar16];
        F[(ulong)rle_i - 1][(ulong)m._3_1_ + 0xfe] = F[(ulong)rle_i - 1][(ulong)m._3_1_ + 0xfe] + 1;
        (&j)[rle_i] = (&j)[rle_i] + 1;
        rle_i = (uint)m._3_1_;
      }
      T[(ulong)in[in_size >> 2] + 0xfe] = T[(ulong)in[in_size >> 2] + 0xfe] + 1;
      T[(ulong)in[(in_size >> 2) << 1] + 0xfe] = T[(ulong)in[(in_size >> 2) << 1] + 0xfe] + 1;
      T[(ulong)in[(in_size >> 2) * 3] + 0xfe] = T[(ulong)in[(in_size >> 2) * 3] + 0xfe] + 1;
      j = j + 3;
      local_4c = 0;
      for (uVar16 = 0; (int)uVar16 < 0x100; uVar16 = uVar16 + 1) {
        if ((&j)[(int)uVar16] != 0) {
          F_i_ = (int *)(4096.0 / (double)(&j)[(int)uVar16]);
          iVar15 = 0;
          x = 0;
          M = 0;
          for (t2 = 0; t2 < 0x100; t2 = t2 + 1) {
            if (F[(long)(int)uVar16 + -1][(long)t2 + 0xfe] != 0) {
              if ((int)x < F[(long)(int)uVar16 + -1][(long)t2 + 0xfe]) {
                x = F[(long)(int)uVar16 + -1][(long)t2 + 0xfe];
                iVar15 = t2;
              }
              iVar5 = (int)((double)F[(long)(int)uVar16 + -1][(long)t2 + 0xfe] * (double)F_i_);
              F[(long)(int)uVar16 + -1][(long)t2 + 0xfe] = iVar5;
              if (iVar5 == 0) {
                F[(long)(int)uVar16 + -1][(long)t2 + 0xfe] = 1;
              }
              M = F[(long)(int)uVar16 + -1][(long)t2 + 0xfe] + M;
            }
          }
          iVar5 = M + 1;
          if (iVar5 < 0x1000) {
            F[(long)(int)uVar16 + -1][(long)iVar15 + 0xfe] =
                 (0x1000 - iVar5) + F[(long)(int)uVar16 + -1][(long)iVar15 + 0xfe];
          }
          else {
            F[(long)(int)uVar16 + -1][(long)iVar15 + 0xfe] =
                 F[(long)(int)uVar16 + -1][(long)iVar15 + 0xfe] - (M + -0xfff);
          }
          if (local_4c == 0) {
            pbVar8 = _tab_size + 1;
            *_tab_size = (byte)uVar16;
            if ((uVar16 != 0) && (uVar6 = uVar16, (&j)[(int)(uVar16 - 1)] != 0)) {
              do {
                local_4c = uVar6 + 1;
                bVar10 = false;
                if (local_4c < 0x100) {
                  bVar10 = (&j)[local_4c] != 0;
                }
                uVar6 = local_4c;
              } while (bVar10);
              local_4c = local_4c - (uVar16 + 1);
              *pbVar8 = (byte)local_4c;
              pbVar8 = _tab_size + 2;
            }
          }
          else {
            local_4c = local_4c + -1;
            pbVar8 = _tab_size;
          }
          _tab_size = pbVar8;
          _rans1 = F[(long)(int)uVar16 + -1] + 0xfe;
          p._4_4_ = 0;
          local_50 = 0;
          M = iVar5;
          for (t2 = 0; t2 < 0x100; t2 = t2 + 1) {
            if (_rans1[t2] != 0) {
              if (local_50 == 0) {
                pbVar8 = _tab_size + 1;
                *_tab_size = (byte)t2;
                if ((t2 != 0) && (uVar6 = t2, _rans1[t2 + -1] != 0)) {
                  do {
                    local_50 = uVar6 + 1;
                    bVar10 = false;
                    if (local_50 < 0x100) {
                      bVar10 = _rans1[local_50] != 0;
                    }
                    uVar6 = local_50;
                  } while (bVar10);
                  local_50 = local_50 - (t2 + 1);
                  *pbVar8 = (byte)local_50;
                  pbVar8 = _tab_size + 2;
                }
              }
              else {
                local_50 = local_50 + -1;
                pbVar8 = _tab_size;
              }
              _tab_size = pbVar8;
              if (_rans1[t2] < 0x80) {
                *_tab_size = (byte)_rans1[t2];
                _tab_size = _tab_size + 1;
              }
              else {
                pbVar8 = _tab_size + 1;
                *_tab_size = (byte)((uint)_rans1[t2] >> 8) | 0x80;
                _tab_size = _tab_size + 2;
                *pbVar8 = (byte)_rans1[t2];
              }
              RansEncSymbolInit((RansEncSymbol *)&syms[(long)(int)uVar16 + -1][(long)t2 + 0xff].bias
                                ,p._4_4_,_rans1[t2],0xc);
              p._4_4_ = _rans1[t2] + p._4_4_;
            }
          }
          *_tab_size = 0;
          _tab_size = _tab_size + 1;
        }
      }
      *_tab_size = 0;
      uVar16 = ((int)_tab_size + 1) - (int)in_local;
      if (0x30602 < uVar16) {
        __assert_fail("tab_size < 257*257*3",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                      ,0x1dd,
                      "unsigned char *rans_compress_O1(unsigned char *, unsigned int, unsigned int *)"
                     );
      }
      RansEncInit(&rans2);
      RansEncInit(&rans3);
      RansEncInit((RansState *)((long)&ptr + 4));
      RansEncInit((RansState *)&ptr);
      uVar6 = in_size >> 2;
      i2 = uVar6 - 2;
      i3 = uVar6 * 2 + -2;
      iVar15 = uVar6 * 3 + -2;
      c3_1 = in[(int)(uVar6 - 1)];
      bVar14 = in[(int)(uVar6 * 2 + -1)];
      bVar13 = in[(int)(uVar6 * 3 + -1)];
      bVar12 = in[in_size - 1];
      _i0 = puVar7;
      for (iVar5 = in_size - 2; (int)(uVar6 * 4 + -2) < iVar5; iVar5 = iVar5 + -1) {
        bVar1 = in[iVar5];
        RansEncPutSymbol((RansState *)&ptr,(uint8_t **)&i0,
                         (RansEncSymbol *)&syms[(ulong)bVar1 - 1][(ulong)bVar12 + 0xff].bias);
        bVar12 = bVar1;
      }
      for (; -1 < i2; i2 = i2 + -1) {
        bVar1 = in[iVar5];
        bVar2 = in[iVar15];
        bVar3 = in[i3];
        bVar4 = in[i2];
        RansEncPutSymbol((RansState *)&ptr,(uint8_t **)&i0,
                         (RansEncSymbol *)&syms[(ulong)bVar1 - 1][(ulong)bVar12 + 0xff].bias);
        RansEncPutSymbol((RansState *)((long)&ptr + 4),(uint8_t **)&i0,
                         (RansEncSymbol *)&syms[(ulong)bVar2 - 1][(ulong)bVar13 + 0xff].bias);
        RansEncPutSymbol(&rans3,(uint8_t **)&i0,
                         (RansEncSymbol *)&syms[(ulong)bVar3 - 1][(ulong)bVar14 + 0xff].bias);
        RansEncPutSymbol(&rans2,(uint8_t **)&i0,
                         (RansEncSymbol *)&syms[(ulong)bVar4 - 1][(ulong)c3_1 + 0xff].bias);
        i3 = i3 + -1;
        iVar15 = iVar15 + -1;
        iVar5 = iVar5 + -1;
        bVar12 = bVar1;
        bVar13 = bVar2;
        bVar14 = bVar3;
        c3_1 = bVar4;
      }
      RansEncPutSymbol((RansState *)&ptr,(uint8_t **)&i0,
                       (RansEncSymbol *)&syms[-1][(ulong)bVar12 + 0xff].bias);
      RansEncPutSymbol((RansState *)((long)&ptr + 4),(uint8_t **)&i0,
                       (RansEncSymbol *)&syms[-1][(ulong)bVar13 + 0xff].bias);
      RansEncPutSymbol(&rans3,(uint8_t **)&i0,(RansEncSymbol *)&syms[-1][(ulong)bVar14 + 0xff].bias)
      ;
      RansEncPutSymbol(&rans2,(uint8_t **)&i0,(RansEncSymbol *)&syms[-1][(ulong)c3_1 + 0xff].bias);
      RansEncFlush((RansState *)&ptr,(uint8_t **)&i0);
      RansEncFlush((RansState *)((long)&ptr + 4),(uint8_t **)&i0);
      RansEncFlush(&rans3,(uint8_t **)&i0);
      RansEncFlush(&rans2,(uint8_t **)&i0);
      *out_size = ((int)puVar7 - (int)_i0) + uVar16;
      *in_local = '\x01';
      in_local[1] = (char)*out_size + 0xf7;
      in_local[2] = (uchar)(*out_size - 9 >> 8);
      in_local[3] = (uchar)(*out_size - 9 >> 0x10);
      in_local[4] = (uchar)(*out_size - 9 >> 0x18);
      in_local[5] = (uchar)in_size;
      in_local[6] = (uchar)(in_size >> 8);
      in_local[7] = (uchar)(in_size >> 0x10);
      in_local[8] = (uchar)(in_size >> 0x18);
      memmove(in_local + uVar16,_i0,(long)puVar7 - (long)_i0);
    }
  }
  return in_local;
}

Assistant:

unsigned char *rans_compress_O1(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf, *out_end, *cp;
    unsigned int last_i, tab_size, rle_i, rle_j;
    RansEncSymbol syms[256][256];

    if (in_size < 4)
	return rans_compress_O0(in, in_size, out_size);

    out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    if (!out_buf)
	return NULL;

    out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;
    cp = out_buf+9;

    int F[256][256], T[256], i, j;
    unsigned char c;

    memset(F, 0, 256*256*sizeof(int));
    memset(T, 0, 256*sizeof(int));
    //for (last = 0, i=in_size-1; i>=0; i--) {
    //	F[last][c = in[i]]++;
    //	T[last]++;
    //	last = c;
    //}

    for (last_i=i=0; i<in_size; i++) {
	F[last_i][c = in[i]]++;
	T[last_i]++;
	last_i = c;
    }
    F[0][in[1*(in_size>>2)]]++;
    F[0][in[2*(in_size>>2)]]++;
    F[0][in[3*(in_size>>2)]]++;
    T[0]+=3;

    // Normalise so T[i] == TOTFREQ
    for (rle_i = i = 0; i < 256; i++) {
	int t2, m, M;
	unsigned int x;

	if (T[i] == 0)
	    continue;

	//uint64_t p = (TOTFREQ * TOTFREQ) / t;
	double p = ((double)TOTFREQ)/T[i];
	for (t2 = m = M = j = 0; j < 256; j++) {
	    if (!F[i][j])
		continue;

	    if (m < F[i][j])
		m = F[i][j], M = j;

	    //if ((F[i][j] = (F[i][j] * p) / TOTFREQ) == 0)
	    if ((F[i][j] *= p) == 0)
		F[i][j] = 1;
	    t2 += F[i][j];
	}

	t2++;
	if (t2 < TOTFREQ)
	    F[i][M] += TOTFREQ-t2;
	else
	    F[i][M] -= t2-TOTFREQ;

	// Store frequency table
	// i
	if (rle_i) {
	    rle_i--;
	} else {
	    *cp++ = i;
	    // FIXME: could use order-0 statistics to observe which alphabet
	    // symbols are present and base RLE on that ordering instead.
	    if (i && T[i-1]) {
		for(rle_i=i+1; rle_i<256 && T[rle_i]; rle_i++)
		    ;
		rle_i -= i+1;
		*cp++ = rle_i;
	    }
	}

	int *F_i_ = F[i];
	x = 0;
	rle_j = 0;
	for (j = 0; j < 256; j++) {
	    if (F_i_[j]) {
		//fprintf(stderr, "F[%d][%d]=%d, x=%d\n", i, j, F_i_[j], x);

		// j
		if (rle_j) {
		    rle_j--;
		} else {
		    *cp++ = j;
		    if (!rle_j && j && F_i_[j-1]) {
			for(rle_j=j+1; rle_j<256 && F_i_[rle_j]; rle_j++)
			    ;
			rle_j -= j+1;
			*cp++ = rle_j;
		    }
		}

		// F_i_[j]
		if (F_i_[j]<128) {
		    *cp++ = F_i_[j];
		} else {
		    *cp++ = 128 | (F_i_[j]>>8);
		    *cp++ = F_i_[j]&0xff;
		}

		RansEncSymbolInit(&syms[i][j], x, F_i_[j], TF_SHIFT);
		x += F_i_[j];
	    }
	}
	*cp++ = 0;
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp - out_buf;
    assert(tab_size < 257*257*3);

    RansState rans0, rans1, rans2, rans3;
    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    uint8_t* ptr = out_end;

    int isz4 = in_size>>2;
    int i0 = 1*isz4-2;
    int i1 = 2*isz4-2;
    int i2 = 3*isz4-2;
    int i3 = 4*isz4-2;

    unsigned char l0 = in[i0+1];
    unsigned char l1 = in[i1+1];
    unsigned char l2 = in[i2+1];
    unsigned char l3 = in[i3+1];

    // Deal with the remainder
    l3 = in[in_size-1];
    for (i3 = in_size-2; i3 > 4*isz4-2; i3--) {
	unsigned char c3 = in[i3];
	RansEncPutSymbol(&rans3, &ptr, &syms[c3][l3]);
	l3 = c3;
    }

    for (; i0 >= 0; i0--, i1--, i2--, i3--) {
	unsigned char c0, c1, c2, c3;
	RansEncSymbol *s3 = &syms[c3 = in[i3]][l3];
	RansEncSymbol *s2 = &syms[c2 = in[i2]][l2];
	RansEncSymbol *s1 = &syms[c1 = in[i1]][l1];
	RansEncSymbol *s0 = &syms[c0 = in[i0]][l0];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);

	l0 = c0;
	l1 = c1;
	l2 = c2;
	l3 = c3;
    }

    RansEncPutSymbol(&rans3, &ptr, &syms[0][l3]);
    RansEncPutSymbol(&rans2, &ptr, &syms[0][l2]);
    RansEncPutSymbol(&rans1, &ptr, &syms[0][l1]);
    RansEncPutSymbol(&rans0, &ptr, &syms[0][l0]);

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;
    *cp++ = 1; // order

    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}